

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion_facade.c
# Opt level: O0

int do_gm_search_logic(SPEED_FEATURES *sf,int frame)

{
  bool local_22;
  bool local_21;
  int frame_local;
  SPEED_FEATURES *sf_local;
  uint local_4;
  
  switch((sf->gm_sf).gm_search_type) {
  case '\0':
    local_4 = 1;
    break;
  case '\x01':
    local_21 = frame == 2 || frame == 3;
    local_4 = (uint)((local_21 ^ 0xffU) & 1);
    break;
  case '\x02':
    local_22 = true;
    if ((frame != 2) && (local_22 = true, frame != 3)) {
      local_22 = frame == 6;
    }
    local_4 = (uint)((local_22 ^ 0xffU) & 1);
    break;
  case '\x03':
    local_4 = 1;
    break;
  case '\x04':
    local_4 = 0;
    break;
  default:
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int do_gm_search_logic(SPEED_FEATURES *const sf, int frame) {
  (void)frame;
  switch (sf->gm_sf.gm_search_type) {
    case GM_FULL_SEARCH: return 1;
    case GM_REDUCED_REF_SEARCH_SKIP_L2_L3:
      return !(frame == LAST2_FRAME || frame == LAST3_FRAME);
    case GM_REDUCED_REF_SEARCH_SKIP_L2_L3_ARF2:
      return !(frame == LAST2_FRAME || frame == LAST3_FRAME ||
               (frame == ALTREF2_FRAME));
    case GM_SEARCH_CLOSEST_REFS_ONLY: return 1;
    case GM_DISABLE_SEARCH: return 0;
    default: assert(0);
  }
  return 1;
}